

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

void Cec_SetActivityFactors_rec(Cec_ManSat_t *p,Gia_Obj_t *pObj,int LevelMin,int LevelMax)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int iVar;
  float dActConeBumpMax;
  int LevelMax_local;
  int LevelMin_local;
  Gia_Obj_t *pObj_local;
  Cec_ManSat_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p->pAig,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p->pAig,pObj);
    iVar1 = Gia_ObjLevel(p->pAig,pObj);
    if ((LevelMin < iVar1) && (iVar1 = Gia_ObjIsCi(pObj), iVar1 == 0)) {
      iVar1 = Cec_ObjSatNum(p,pObj);
      if (iVar1 != 0) {
        iVar2 = Gia_ObjLevel(p->pAig,pObj);
        p->pSat->factors[iVar1] =
             (double)(((float)(iVar2 - LevelMin) * 20.0) / (float)(LevelMax - LevelMin));
        veci_push(&p->pSat->act_vars,iVar1);
      }
      pGVar3 = Gia_ObjFanin0(pObj);
      Cec_SetActivityFactors_rec(p,pGVar3,LevelMin,LevelMax);
      pGVar3 = Gia_ObjFanin1(pObj);
      Cec_SetActivityFactors_rec(p,pGVar3,LevelMin,LevelMax);
    }
  }
  return;
}

Assistant:

void Cec_SetActivityFactors_rec( Cec_ManSat_t * p, Gia_Obj_t * pObj, int LevelMin, int LevelMax )
{
    float dActConeBumpMax = 20.0;
    int iVar;
    // skip visited variables
    if ( Gia_ObjIsTravIdCurrent(p->pAig, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p->pAig, pObj);
    // add the PI to the list
    if ( Gia_ObjLevel(p->pAig, pObj) <= LevelMin || Gia_ObjIsCi(pObj) )
        return;
    // set the factor of this variable
    // (LevelMax-LevelMin) / (pObj->Level-LevelMin) = p->pPars->dActConeBumpMax / ThisBump
    if ( (iVar = Cec_ObjSatNum(p,pObj)) )
    {
        p->pSat->factors[iVar] = dActConeBumpMax * (Gia_ObjLevel(p->pAig, pObj) - LevelMin)/(LevelMax - LevelMin);
        veci_push(&p->pSat->act_vars, iVar);
    }
    // explore the fanins
    Cec_SetActivityFactors_rec( p, Gia_ObjFanin0(pObj), LevelMin, LevelMax );
    Cec_SetActivityFactors_rec( p, Gia_ObjFanin1(pObj), LevelMin, LevelMax );
}